

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::entry_point_arg_stage_in_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  ExecutionModel EVar1;
  SPIRVariable *var;
  SPIRType *pSVar2;
  char (*in_R9) [14];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  if ((EVar1 != ExecutionModelTessellationControl) ||
     ((this->msl_options).multi_patch_workgroup == false)) {
    EVar1 = Compiler::get_execution_model((Compiler *)this);
    if ((EVar1 != ExecutionModelTessellationEvaluation) ||
       ((this->msl_options).raw_buffer_tese_input == false)) {
      EVar1 = Compiler::get_execution_model((Compiler *)this);
      if (this->next_metal_resource_ids
          [(ulong)(EVar1 == ExecutionModelTessellationEvaluation) * 2 + 8] != 0) {
        var = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         this->next_metal_resource_ids
                         [(ulong)(EVar1 == ExecutionModelTessellationEvaluation) * 2 + 8]);
        pSVar2 = Compiler::get_variable_data_type((Compiler *)this,var);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_68,this,pSVar2,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_88,this,(ulong)(var->super_IVariant).self.id,1);
        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[14]>
                  (&local_48,(spirv_cross *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f14f1,
                   (char (*) [2])local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[stage_in]]",in_R9);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0]);
        }
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::entry_point_arg_stage_in()
{
	string decl;

	if ((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
	    (is_tese_shader() && msl_options.raw_buffer_tese_input))
		return decl;

	// Stage-in structure
	uint32_t stage_in_id;
	if (is_tese_shader())
		stage_in_id = patch_stage_in_var_id;
	else
		stage_in_id = stage_in_var_id;

	if (stage_in_id)
	{
		auto &var = get<SPIRVariable>(stage_in_id);
		auto &type = get_variable_data_type(var);

		add_resource_name(var.self);
		decl = join(type_to_glsl(type), " ", to_name(var.self), " [[stage_in]]");
	}

	return decl;
}